

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.c
# Opt level: O2

void enable_dma(char *pci_addr)

{
  uint __line;
  int iVar1;
  __off_t _Var2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  undefined8 uStackY_1230;
  uint16_t dma;
  char buf [512];
  char path [4096];
  
  snprintf(path,0x1000,"/sys/bus/pci/devices/%s/config",pci_addr);
  iVar1 = open(path,2);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    __xpg_strerror_r(iVar1,buf,0x200);
    pcVar5 = "open pci config";
    uStackY_1230 = 0x1d;
LAB_001028d8:
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",
            uStackY_1230,"enable_dma",pcVar5,buf);
    exit(iVar1);
  }
  _Var2 = lseek(iVar1,4,0);
  if (_Var2 == 4) {
    dma = 0;
    sVar3 = read(iVar1,&dma,2);
    if (sVar3 == 2) {
      dma = dma | 4;
      _Var2 = lseek(iVar1,4,0);
      if (_Var2 == 4) {
        sVar3 = write(iVar1,&dma,2);
        if (sVar3 == 2) {
          iVar1 = close(iVar1);
          if (iVar1 != -1) {
            return;
          }
          piVar4 = __errno_location();
          iVar1 = *piVar4;
          __xpg_strerror_r(iVar1,buf,0x200);
          pcVar5 = "close";
          uStackY_1230 = 0x26;
          goto LAB_001028d8;
        }
        pcVar5 = "write(fd, &dma, 2) == 2";
        __line = 0x25;
      }
      else {
        pcVar5 = "lseek(fd, 4, SEEK_SET) == 4";
        __line = 0x24;
      }
    }
    else {
      pcVar5 = "read(fd, &dma, 2) == 2";
      __line = 0x22;
    }
  }
  else {
    pcVar5 = "lseek(fd, 4, SEEK_SET) == 4";
    __line = 0x20;
  }
  __assert_fail(pcVar5,"/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",
                __line,"void enable_dma(const char *)");
}

Assistant:

void enable_dma(const char* pci_addr) {
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/config", pci_addr);
	int fd = check_err(open(path, O_RDWR), "open pci config");
	// write to the command register (offset 4) in the PCIe config space
	// bit 2 is "bus master enable", see PCIe 3.0 specification section 7.5.1.1
	assert(lseek(fd, 4, SEEK_SET) == 4);
	uint16_t dma = 0;
	assert(read(fd, &dma, 2) == 2);
	dma |= 1 << 2;
	assert(lseek(fd, 4, SEEK_SET) == 4);
	assert(write(fd, &dma, 2) == 2);
	check_err(close(fd), "close");
}